

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall
cmStateDirectory::PrependIncludeDirectoriesEntry
          (cmStateDirectory *this,string *vec,cmListFileBacktrace *lfbt)

{
  PositionType *this_00;
  pointer pbVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pbVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  const_iterator local_48;
  pointer local_40;
  pointer local_38;
  
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pbVar1 = (pBVar5->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &(this->Snapshot_).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  sVar2 = pSVar6->IncludeDirectoryPosition;
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  local_40 = (pBVar5->IncludeDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_38 = pbVar1 + sVar2;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
            (&local_48,&local_38,&local_40,&::cmPropertySentinal_abi_cxx11_);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pbVar1 = (pBVar5->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pcVar3 = (pBVar5->IncludeDirectoryBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&pBVar5->IncludeDirectories,local_48,vec);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&pBVar5->IncludeDirectoryBacktraces,
             (cmListFileBacktrace *)((long)local_48._M_current + ((long)pcVar3 - (long)pbVar1)),lfbt
            );
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pbVar1 = (pBVar5->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (pBVar5->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar6->IncludeDirectoryPosition = (long)pbVar1 - (long)pbVar4 >> 5;
  return;
}

Assistant:

void cmStateDirectory::PrependIncludeDirectoriesEntry(
  const std::string& vec, const cmListFileBacktrace& lfbt)
{
  std::vector<std::string>::iterator entryEnd =
    this->DirectoryState->IncludeDirectories.begin() +
    this->Snapshot_.Position->IncludeDirectoryPosition;

  std::vector<std::string>::reverse_iterator rend =
    this->DirectoryState->IncludeDirectories.rend();
  std::vector<std::string>::reverse_iterator rbegin =
    cmMakeReverseIterator(entryEnd);
  rbegin = std::find(rbegin, rend, cmPropertySentinal);

  std::vector<std::string>::iterator entryIt = rbegin.base();
  std::vector<std::string>::iterator entryBegin =
    this->DirectoryState->IncludeDirectories.begin();

  std::vector<cmListFileBacktrace>::iterator btIt =
    this->DirectoryState->IncludeDirectoryBacktraces.begin() +
    std::distance(entryBegin, entryIt);

  this->DirectoryState->IncludeDirectories.insert(entryIt, vec);
  this->DirectoryState->IncludeDirectoryBacktraces.insert(btIt, lfbt);

  this->Snapshot_.Position->IncludeDirectoryPosition =
    this->DirectoryState->IncludeDirectories.size();
}